

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O2

void __thiscall
chrono::ChParticleCloud::AddParticle(ChParticleCloud *this,ChCoordsys<double> *initial_state)

{
  ChAparticle *this_00;
  ChContactable_1vars<6> *pCVar1;
  ChAparticle *newp;
  ChAparticle *local_28;
  
  this_00 = (ChAparticle *)Eigen::internal::aligned_malloc(0x1a0);
  ChAparticle::ChAparticle(this_00);
  local_28 = this_00;
  ChFrame<double>::SetCoord((ChFrame<double> *)this_00,initial_state);
  this_00->container = this;
  std::vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>::push_back
            (&this->particles,&local_28);
  (local_28->variables).sharedmass = &this->particle_mass;
  (local_28->variables).super_ChVariablesBody.user_data = this;
  pCVar1 = &local_28->super_ChContactable_1vars<6>;
  if (local_28 == (ChAparticle *)0x0) {
    pCVar1 = (ChContactable_1vars<6> *)0x0;
  }
  (*local_28->collision_model->_vptr_ChCollisionModel[0x16])(local_28->collision_model,pCVar1);
  (*local_28->collision_model->_vptr_ChCollisionModel[0x14])
            (local_28->collision_model,this->particle_collision_model);
  (*local_28->collision_model->_vptr_ChCollisionModel[4])();
  return;
}

Assistant:

void ChParticleCloud::AddParticle(ChCoordsys<double> initial_state) {
    ChAparticle* newp = new ChAparticle;
    newp->SetCoord(initial_state);

    newp->SetContainer(this);

    particles.push_back(newp);

    newp->variables.SetSharedMass(&particle_mass);
    newp->variables.SetUserData((void*)this);  // UserData unuseful in future parallel solver?

    newp->collision_model->SetContactable(newp);
    // newp->collision_model->ClearModel(); // wasn't already added to system, no need to remove
    newp->collision_model->AddCopyOfAnotherModel(particle_collision_model);
    newp->collision_model->BuildModel();  // will also add to system, if collision is on.
}